

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O2

void __thiscall
wasm::HashStringifyWalker::addUniqueSymbol(HashStringifyWalker *this,SeparatorReason reason)

{
  uint uVar1;
  char in_DL;
  size_t *in_RSI;
  pair<const_unsigned_int,_wasm::Name> local_30;
  
  uVar1 = this->nextSeparatorVal;
  if (this->nextVal <= uVar1) {
    if (in_DL == '\0') {
      local_30.first =
           (uint)((ulong)((long)(this->hashString).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->hashString).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      local_30.second.super_IString.str._M_len = *in_RSI;
      local_30.second.super_IString.str._M_str = (char *)in_RSI[1];
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::_Select1st<std::pair<unsigned_int_const,wasm::Name>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,wasm::Name>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::_Select1st<std::pair<unsigned_int_const,wasm::Name>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>>
                  *)&this->idxToFuncName,&local_30);
      uVar1 = this->nextSeparatorVal;
    }
    local_30.first = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->hashString,&local_30.first);
    this->nextSeparatorVal = this->nextSeparatorVal + -1;
    local_30.first = 0;
    local_30._4_4_ = 0;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&this->exprs,
               (Expression **)&local_30);
    return;
  }
  __assert_fail("(uint32_t)nextSeparatorVal >= nextVal",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/hash-stringify-walker.cpp"
                ,0x3b,"void wasm::HashStringifyWalker::addUniqueSymbol(SeparatorReason)");
}

Assistant:

void HashStringifyWalker::addUniqueSymbol(SeparatorReason reason) {
  // Use a negative value to distinguish symbols for separators from symbols
  // for Expressions
  assert((uint32_t)nextSeparatorVal >= nextVal);
  if (auto funcStart = reason.getFuncStart()) {
    idxToFuncName.insert({hashString.size(), funcStart->func->name});
  }
  hashString.push_back((uint32_t)nextSeparatorVal);
  nextSeparatorVal--;
  exprs.push_back(nullptr);
}